

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O0

void Corrade::Containers::ArrayMallocAllocator<unsigned_int>::reallocate
               (uint **array,size_t param_2,size_t newCapacity)

{
  undefined8 uVar1;
  Debug *pDVar2;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_59;
  Error local_58 [40];
  undefined8 *local_30;
  char *memory;
  size_t inBytes;
  size_t newCapacity_local;
  size_t param_1_local;
  uint **array_local;
  
  memory = (char *)(newCapacity * 4 + 8);
  inBytes = newCapacity;
  newCapacity_local = param_2;
  param_1_local = (size_t)array;
  local_30 = (undefined8 *)realloc(*array + -2,(size_t)memory);
  if (local_30 == (undefined8 *)0x0) {
    uVar1 = Corrade::Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_59);
    Corrade::Utility::Error::Error(local_58,uVar1,local_59._value);
    pDVar2 = (Debug *)Corrade::Utility::Debug::operator<<
                                ((Debug *)local_58,
                                 "Containers::ArrayMallocAllocator: can\'t reallocate");
    pDVar2 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar2,(ulong)memory);
    Corrade::Utility::Debug::operator<<(pDVar2,"bytes");
    Corrade::Utility::Error::~Error(local_58);
    abort();
  }
  *local_30 = memory;
  *(undefined8 **)param_1_local = local_30 + 1;
  return;
}

Assistant:

void ArrayMallocAllocator<T>::reallocate(T*& array, std::size_t, const std::size_t newCapacity) {
    const std::size_t inBytes = newCapacity*sizeof(T) + AllocationOffset;
    char* const memory = static_cast<char*>(std::realloc(reinterpret_cast<char*>(array) - AllocationOffset, inBytes));
    CORRADE_ASSERT(memory,
        "Containers::ArrayMallocAllocator: can't reallocate" << inBytes << "bytes", );
    reinterpret_cast<std::size_t*>(memory)[0] = inBytes;
    array = reinterpret_cast<T*>(memory + AllocationOffset);
}